

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlIsRef(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_78;
  PyObject *local_70;
  PyObject *local_68;
  undefined *local_60;
  PyObject *pyobj_attr;
  xmlAttrPtr attr;
  PyObject *pyobj_elem;
  xmlNodePtr elem;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlIsRef");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"OOO:xmlIsRef",&elem,&attr,&local_60);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (elem == (xmlNodePtr)&_Py_NoneStruct) {
        local_68 = (PyObject *)0x0;
      }
      else {
        local_68 = (PyObject *)elem->name;
      }
      pyobj_doc = local_68;
      if (attr == (xmlAttrPtr)&_Py_NoneStruct) {
        local_70 = (PyObject *)0x0;
      }
      else {
        local_70 = (PyObject *)attr->name;
      }
      pyobj_elem = local_70;
      if (local_60 == &_Py_NoneStruct) {
        local_78 = (PyObject *)0x0;
      }
      else {
        local_78 = *(PyObject **)(local_60 + 0x10);
      }
      pyobj_attr = local_78;
      doc._4_4_ = xmlIsRef(local_68,local_70,local_78);
      self_local = libxml_intWrap(doc._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlIsRef(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr elem;
    PyObject *pyobj_elem;
    xmlAttrPtr attr;
    PyObject *pyobj_attr;

    if (libxml_deprecationWarning("xmlIsRef") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOO:xmlIsRef", &pyobj_doc, &pyobj_elem, &pyobj_attr))
        return(NULL);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (xmlNodePtr) PyxmlNode_Get(pyobj_elem);
    attr = (xmlAttrPtr) PyxmlNode_Get(pyobj_attr);

    c_retval = xmlIsRef(doc, elem, attr);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}